

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_search.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
::search_nearest(search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  bool bVar1;
  double *begin1;
  metric_l2_squared *this_00;
  scalar_type *psVar2;
  scalar_type *psVar3;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  *in_RSI;
  long in_RDI;
  node_type *in_XMM0_Qa;
  node_type *node_00;
  scalar_type sVar4;
  scalar_type old_offset;
  node_type *node_2nd;
  node_type *node_1st;
  scalar_type new_offset;
  scalar_type v;
  size_t split_dim;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  metric_l2_squared *in_stack_ffffffffffffff60;
  point<double,_2UL> *this_01;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff68
  ;
  index_type idx;
  search_nn<pico_tree::neighbor<int,_double>_> *this_02;
  double local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffe0;
  
  bVar1 = kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>::is_leaf
                    ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_> *
                     )in_RSI);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      this_02 = *(search_nn<pico_tree::neighbor<int,_double>_> **)(in_RDI + 0x30);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      begin1 = (double *)(in_RDI + 8);
      this_00 = (metric_l2_squared *)
                point_wrapper<std::array<double,_2UL>_>::begin
                          ((point_wrapper<std::array<double,_2UL>_> *)0x10b351);
      psVar2 = point_wrapper<std::array<double,_2UL>_>::end
                         ((point_wrapper<std::array<double,_2UL>_> *)in_stack_ffffffffffffff60);
      idx = (index_type)((ulong)psVar2 >> 0x20);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>::operator[]<int>
                ((space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> *)
                 in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      metric_l2_squared::operator()
                (this_00,begin1,(double *)in_stack_ffffffffffffff60,
                 (double *)in_stack_ffffffffffffff58);
      search_nn<pico_tree::neighbor<int,_double>_>::operator()(this_02,idx,(scalar_type)this_00);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
  }
  else {
    psVar2 = point_wrapper<std::array<double,_2UL>_>::operator[]
                       ((point_wrapper<std::array<double,_2UL>_> *)in_stack_ffffffffffffff60,
                        (size_t)in_stack_ffffffffffffff58);
    if ((((double)(in_RSI->query_).point_ + (in_RSI->node_box_offset_).elems_._M_elems[0]) - *psVar2
        ) - *psVar2 <= 0.0) {
      local_50 = metric_l2_squared::operator()
                           (in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
    }
    else {
      local_50 = metric_l2_squared::operator()
                           (in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
    }
    search_nearest(in_RSI,in_XMM0_Qa,(scalar_type)in_stack_ffffffffffffffe0._M_current);
    psVar3 = point<double,_2UL>::operator[]
                       ((point<double,_2UL> *)in_stack_ffffffffffffff60,
                        (size_type)in_stack_ffffffffffffff58);
    this_01 = (point<double,_2UL> *)*psVar3;
    node_00 = (node_type *)(((double)in_XMM0_Qa - (double)this_01) + local_50);
    sVar4 = search_nn<pico_tree::neighbor<int,_double>_>::max
                      (*(search_nn<pico_tree::neighbor<int,_double>_> **)(in_RDI + 0x30));
    if ((double)node_00 <= sVar4) {
      psVar3 = point<double,_2UL>::operator[]
                         ((point<double,_2UL> *)in_stack_ffffffffffffff60,(size_type)local_50);
      *psVar3 = local_50;
      search_nearest(in_RSI,node_00,(scalar_type)in_stack_ffffffffffffffe0._M_current);
      psVar3 = point<double,_2UL>::operator[](this_01,(size_type)local_50);
      *psVar3 = (scalar_type)this_01;
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      size_t const split_dim = static_cast<size_t>(node->data.branch.split_dim);
      scalar_type const v = query_[split_dim];
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      scalar_type const old_offset = node_box_offset_[split_dim];
      node_box_distance = node_box_distance - old_offset + new_offset;

      // The value visitor->max() contains the current nearest neighbor distance
      // or otherwise current maximum search distance. When testing against the
      // split value we determine if we should go into the neighboring node.
      if (visitor_.max() >= node_box_distance) {
        node_box_offset_[split_dim] = new_offset;
        search_nearest(node_2nd, node_box_distance);
        node_box_offset_[split_dim] = old_offset;
      }
    }
  }